

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::
Section6InvalidpathLenConstraintTest11<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section6InvalidpathLenConstraintTest11
          (Section6InvalidpathLenConstraintTest11<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest06VerifyingBasicConstraints,
                     Section6InvalidpathLenConstraintTest11) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "pathLenConstraint6CACert",
                               "pathLenConstraint6subCA1Cert",
                               "pathLenConstraint6subsubCA11Cert",
                               "pathLenConstraint6subsubsubCA11XCert",
                               "InvalidpathLenConstraintTest11EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "pathLenConstraint6CACRL",
                              "pathLenConstraint6subCA1CRL",
                              "pathLenConstraint6subsubCA11CRL",
                              "pathLenConstraint6subsubsubCA11XCRL"};
  PkitsTestInfo info;
  info.test_number = "4.6.11";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}